

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  string *psVar1;
  ostream *poVar2;
  string infoFileName;
  cmGeneratedFileStream infoFileStream;
  cmAlphaNum local_48;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  infoFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar1->_M_dataplus)._M_p;
  infoFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)psVar1->_M_string_length;
  local_48.View_._M_len = 0x2b;
  local_48.View_._M_str = "/CMakeFiles/CMakeDirectoryInformation.cmake";
  cmStrCat<>(&infoFileName,(cmAlphaNum *)&infoFileStream,&local_48);
  cmGeneratedFileStream::cmGeneratedFileStream(&infoFileStream,&infoFileName,false,None);
  if (((&infoFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)infoFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent(&infoFileStream,true);
    WriteDisclaimer(this,(ostream *)&infoFileStream);
    poVar2 = std::operator<<((ostream *)&infoFileStream,
                             "# Relative path conversion top directories.\n");
    poVar2 = std::operator<<(poVar2,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"");
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    psVar1 = cmOutputConverter::GetRelativePathTopSource_abi_cxx11_(this_00);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"\")\n");
    poVar2 = std::operator<<(poVar2,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"");
    psVar1 = cmOutputConverter::GetRelativePathTopBinary_abi_cxx11_(this_00);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"\")\n");
    std::operator<<(poVar2,"\n");
    if (cmSystemTools::s_ForceUnixPaths == true) {
      poVar2 = std::operator<<((ostream *)&infoFileStream,"# Force unix paths in dependencies.\n");
      poVar2 = std::operator<<(poVar2,"set(CMAKE_FORCE_UNIX_PATHS 1)\n");
      std::operator<<(poVar2,"\n");
    }
    poVar2 = std::operator<<((ostream *)&infoFileStream,"\n");
    poVar2 = std::operator<<(poVar2,"# The C and CXX include file regular expressions for ");
    std::operator<<(poVar2,"this directory.\n");
    std::operator<<((ostream *)&infoFileStream,"set(CMAKE_C_INCLUDE_REGEX_SCAN ");
    psVar1 = cmMakefile::GetIncludeRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)&infoFileStream,psVar1);
    std::operator<<((ostream *)&infoFileStream,")\n");
    std::operator<<((ostream *)&infoFileStream,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ");
    WriteCMakeArgument((ostream *)&infoFileStream,
                       &((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile)->
                        ComplainFileRegularExpression);
    std::operator<<((ostream *)&infoFileStream,")\n");
    std::operator<<((ostream *)&infoFileStream,
                    "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n");
    std::operator<<((ostream *)&infoFileStream,
                    "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&infoFileStream);
  std::__cxx11::string::~string((string *)&infoFileName);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName =
    cmStrCat(this->GetCurrentBinaryDirectory(),
             "/CMakeFiles/CMakeDirectoryInformation.cmake");

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->GetRelativePathTopSource() << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->GetRelativePathTopBinary() << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}